

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&> * __thiscall
Catch::ExprLhs<duckdb::ARTKey_const&>::operator==
          (BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&> *__return_storage_ptr__,
          ExprLhs<duckdb::ARTKey_const&> *this,ARTKey *rhs)

{
  ARTKey *pAVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = (bool)duckdb::ARTKey::operator==(*(ARTKey **)this,rhs);
  pAVar1 = *(ARTKey **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_005737e0;
  __return_storage_ptr__->m_lhs = pAVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }